

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

Node * findRule(char *name,int defined)

{
  int iVar1;
  char *pcVar2;
  Node *pNVar3;
  
  pcVar2 = name;
  do {
    if (*pcVar2 == '-') {
      *pcVar2 = '_';
    }
    else {
      pNVar3 = rules;
      if (*pcVar2 == '\0') {
        while( true ) {
          if (pNVar3 == (Node *)0x0) {
            pNVar3 = makeRule(name,defined);
            return pNVar3;
          }
          if (pNVar3->type != 1) break;
          iVar1 = strcmp(name,(pNVar3->rule).name);
          if (iVar1 == 0) {
            return pNVar3;
          }
          pNVar3 = (pNVar3->rule).next;
        }
        __assert_fail("Rule == n->type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                      ,0x4a,"Node *findRule(char *, int)");
      }
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

Node *findRule(char *name, int defined)
{
  Node *n;
  char *ptr;
  for (ptr= name;  *ptr;  ptr++) if ('-' == *ptr) *ptr= '_';
  for (n= rules;  n;  n= n->any.next)
    {
      assert(Rule == n->type);
      if (!strcmp(name, n->rule.name))
	return n;
    }
  return makeRule(name, defined);
}